

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  undefined8 uVar2;
  FILE *__stream;
  size_t sVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  wasm_global_t *pwVar9;
  wasm_global_t *pwVar10;
  wasm_global_t *pwVar11;
  wasm_global_t *pwVar12;
  wasm_func_t *pwVar13;
  wasm_func_t *pwVar14;
  wasm_func_t *pwVar15;
  wasm_func_t *pwVar16;
  wasm_func_t *pwVar17;
  wasm_func_t *pwVar18;
  wasm_func_t *pwVar19;
  wasm_func_t *pwVar20;
  wasm_func_t *pwVar21;
  wasm_func_t *pwVar22;
  wasm_func_t *pwVar23;
  wasm_func_t *pwVar24;
  ulong uVar25;
  undefined1 local_428 [8];
  wasm_val_t results_15 [1];
  wasm_val_t results_14 [1];
  wasm_val_t results_13 [1];
  wasm_val_t results_12 [1];
  wasm_val_t val_15;
  wasm_val_t val_14;
  wasm_val_t val_13;
  wasm_val_t val_12;
  wasm_val_t args78 [1];
  wasm_val_t args77 [1];
  wasm_val_t args74 [1];
  wasm_val_t args73 [1];
  wasm_val_t results_11 [1];
  wasm_val_t results_10 [1];
  wasm_val_t results_9 [1];
  wasm_val_t results_8 [1];
  wasm_val_t val_11;
  wasm_val_t val_10;
  wasm_val_t val_9;
  wasm_val_t val_8;
  wasm_val_t val38;
  wasm_val_t val37;
  wasm_val_t val34;
  wasm_val_t val33;
  wasm_val_t results_7 [1];
  wasm_val_t results_6 [1];
  wasm_val_t results_5 [1];
  wasm_val_t results_4 [1];
  wasm_val_t results_3 [1];
  wasm_val_t results_2 [1];
  wasm_val_t results_1 [1];
  wasm_val_t results [1];
  undefined1 local_220 [8];
  wasm_val_t val_7;
  wasm_val_t val_6;
  wasm_val_t val_5;
  wasm_val_t val_4;
  wasm_val_t val_3;
  wasm_val_t val_2;
  wasm_val_t val_1;
  wasm_val_t val;
  wasm_global_t *copy;
  wasm_func_t *set_var_i64_export;
  wasm_func_t *set_var_f32_export;
  wasm_func_t *set_var_i64_import;
  wasm_func_t *set_var_f32_import;
  wasm_func_t *get_var_i64_export;
  wasm_func_t *get_var_f32_export;
  wasm_func_t *get_const_i64_export;
  wasm_func_t *get_const_f32_export;
  wasm_func_t *get_var_i64_import;
  wasm_func_t *get_var_f32_import;
  wasm_func_t *get_const_i64_import;
  wasm_func_t *get_const_f32_import;
  wasm_global_t *var_i64_export;
  wasm_global_t *var_f32_export;
  wasm_global_t *const_i64_export;
  wasm_global_t *const_f32_export;
  size_t i;
  wasm_extern_vec_t exports;
  wasm_instance_t *instance;
  wasm_extern_t *imports [4];
  wasm_global_t *var_i64_import;
  wasm_val_t val_i64_4;
  wasm_global_t *var_f32_import;
  wasm_val_t val_f32_3;
  wasm_global_t *const_i64_import;
  wasm_val_t val_i64_2;
  wasm_global_t *const_f32_import;
  wasm_val_t val_f32_1;
  wasm_globaltype_t *var_i64_type;
  wasm_globaltype_t *var_f32_type;
  wasm_globaltype_t *const_i64_type;
  wasm_globaltype_t *const_f32_type;
  wasm_module_t *module;
  wasm_byte_vec_t binary;
  size_t file_size;
  FILE *file;
  wasm_store_t *store;
  wasm_engine_t *engine;
  char **argv_local;
  int argc_local;
  
  printf("Initializing...\n");
  uVar1 = wasm_engine_new();
  uVar2 = wasm_store_new(uVar1);
  printf("Loading binary...\n");
  __stream = fopen("global.wasm","r");
  if (__stream == (FILE *)0x0) {
    printf("> Error loading module!\n");
    argv_local._4_4_ = 1;
  }
  else {
    fseek(__stream,0,2);
    binary.data = (wasm_byte_t *)ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(&module,binary.data);
    sVar3 = fread((void *)binary.size,(size_t)binary.data,1,__stream);
    if (sVar3 == 1) {
      fclose(__stream);
      printf("Compiling module...\n");
      lVar4 = wasm_module_new(uVar2,&module);
      if (lVar4 == 0) {
        printf("> Error compiling module!\n");
        argv_local._4_4_ = 1;
      }
      else {
        wasm_byte_vec_delete(&module);
        printf("Creating globals...\n");
        uVar5 = wasm_valtype_new(2);
        uVar5 = wasm_globaltype_new(uVar5,0);
        uVar6 = wasm_valtype_new(1);
        uVar6 = wasm_globaltype_new(uVar6,0);
        uVar7 = wasm_valtype_new(2);
        uVar7 = wasm_globaltype_new(uVar7,1);
        uVar8 = wasm_valtype_new(1);
        val_f32_1.of.i64 = wasm_globaltype_new(uVar8,1);
        const_f32_import = (wasm_global_t *)0x2;
        val_f32_1.kind = '\0';
        val_f32_1._1_7_ = 0x3f8000;
        val_i64_2.of.i64 = wasm_global_new(uVar2,uVar5,&const_f32_import);
        const_i64_import = (wasm_global_t *)0x1;
        val_i64_2.kind = '\x02';
        val_i64_2._1_7_ = 0;
        val_f32_3.of.i64 = wasm_global_new(uVar2,uVar6,&const_i64_import);
        var_f32_import = (wasm_global_t *)0x2;
        val_f32_3.kind = '\0';
        val_f32_3._1_7_ = 0x404000;
        val_i64_4.of.i64 = wasm_global_new(uVar2,uVar7,&var_f32_import);
        var_i64_import = (wasm_global_t *)0x1;
        val_i64_4.kind = '\x04';
        val_i64_4._1_7_ = 0;
        uVar8 = wasm_global_new(uVar2,val_f32_1.of.i64,&var_i64_import);
        wasm_globaltype_delete(uVar5);
        wasm_globaltype_delete(uVar6);
        wasm_globaltype_delete(uVar7);
        wasm_globaltype_delete(val_f32_1.of.i64);
        printf("Instantiating module...\n");
        instance = (wasm_instance_t *)wasm_global_as_extern(val_i64_2.of.i64);
        imports[0] = (wasm_extern_t *)wasm_global_as_extern(val_f32_3.of.i64);
        imports[1] = (wasm_extern_t *)wasm_global_as_extern(val_i64_4.of.i64);
        imports[2] = (wasm_extern_t *)wasm_global_as_extern(uVar8);
        exports.data = (wasm_extern_t **)wasm_instance_new(uVar2,lVar4,&instance,0);
        if (exports.data == (wasm_extern_t **)0x0) {
          printf("> Error instantiating module!\n");
          argv_local._4_4_ = 1;
        }
        else {
          wasm_module_delete(lVar4);
          printf("Extracting exports...\n");
          wasm_instance_exports(exports.data,&i);
          pwVar9 = get_export_global((wasm_extern_vec_t *)&i,0);
          pwVar10 = get_export_global((wasm_extern_vec_t *)&i,1);
          pwVar11 = get_export_global((wasm_extern_vec_t *)&i,2);
          pwVar12 = get_export_global((wasm_extern_vec_t *)&i,3);
          pwVar13 = get_export_func((wasm_extern_vec_t *)&i,4);
          pwVar14 = get_export_func((wasm_extern_vec_t *)&i,5);
          pwVar15 = get_export_func((wasm_extern_vec_t *)&i,6);
          pwVar16 = get_export_func((wasm_extern_vec_t *)&i,7);
          pwVar17 = get_export_func((wasm_extern_vec_t *)&i,8);
          pwVar18 = get_export_func((wasm_extern_vec_t *)&i,9);
          pwVar19 = get_export_func((wasm_extern_vec_t *)&i,10);
          pwVar20 = get_export_func((wasm_extern_vec_t *)&i,0xb);
          pwVar21 = get_export_func((wasm_extern_vec_t *)&i,0xc);
          pwVar22 = get_export_func((wasm_extern_vec_t *)&i,0xd);
          pwVar23 = get_export_func((wasm_extern_vec_t *)&i,0xe);
          pwVar24 = get_export_func((wasm_extern_vec_t *)&i,0xf);
          uVar5 = wasm_global_copy(val_i64_4.of.i64);
          uVar25 = wasm_global_same(val_i64_4.of.i64,uVar5);
          if ((uVar25 & 1) == 0) {
            __assert_fail("wasm_global_same(var_f32_import, copy)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/third_party/wasm-c-api/example/global.c"
                          ,0x98,"int main(int, const char **)");
          }
          wasm_global_delete(uVar5);
          printf("Accessing globals...\n");
          wasm_global_get(val_i64_2.of.i64,&val_1.of);
          if (((float)val._0_4_ != 1.0) || (NAN((float)val._0_4_))) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_global_get(val_f32_3.of.i64,&val_2.of);
          if (val_1._0_8_ != 2) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_global_get(val_i64_4.of.i64,&val_3.of);
          if (((float)val_2._0_4_ != 3.0) || (NAN((float)val_2._0_4_))) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_global_get(uVar8,&val_4.of);
          if (val_3._0_8_ != 4) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_global_get(pwVar9,&val_5.of);
          if (((float)val_4._0_4_ != 5.0) || (NAN((float)val_4._0_4_))) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_global_get(pwVar10,&val_6.of);
          if (val_5._0_8_ != 6) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_global_get(pwVar11,&val_7.of);
          if (((float)val_6._0_4_ != 7.0) || (NAN((float)val_6._0_4_))) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_global_get(pwVar12,local_220);
          if (val_7._0_8_ != 8) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_func_call(pwVar13,0,&results_1[0].of);
          if (((float)results[0]._0_4_ != 1.0) || (NAN((float)results[0]._0_4_))) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_func_call(pwVar14,0,&results_2[0].of);
          if (results_1[0]._0_8_ != 2) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_func_call(pwVar15,0,&results_3[0].of);
          if (((float)results_2[0]._0_4_ != 3.0) || (NAN((float)results_2[0]._0_4_))) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_func_call(pwVar16,0,&results_4[0].of);
          if (results_3[0]._0_8_ != 4) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_func_call(pwVar17,0,&results_5[0].of);
          if (((float)results_4[0]._0_4_ != 5.0) || (NAN((float)results_4[0]._0_4_))) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_func_call(pwVar18,0,&results_6[0].of);
          if (results_5[0]._0_8_ != 6) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_func_call(pwVar19,0,&results_7[0].of);
          if (((float)results_6[0]._0_4_ != 7.0) || (NAN((float)results_6[0]._0_4_))) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_func_call(pwVar20,0,&val33.of);
          if (results_7[0]._0_8_ != 8) {
            printf("> Error reading value\n");
            exit(1);
          }
          val34.of.i64 = 2;
          val33.kind = '\0';
          val33._1_7_ = 0x420400;
          wasm_global_set(val_i64_4.of.i64,&val34.of);
          val37.of.i64 = 1;
          val34.kind = '\"';
          val34._1_7_ = 0;
          wasm_global_set(uVar8,&val37.of);
          val38.of.i64 = 2;
          val37.kind = '\0';
          val37._1_7_ = 0x421400;
          wasm_global_set(pwVar11,&val38.of);
          val_8.of.i64 = 1;
          val38.kind = '&';
          val38._1_7_ = 0;
          wasm_global_set(pwVar12,&val_8.of);
          wasm_global_get(val_i64_4.of.i64,&val_9.of);
          if (((float)val_8._0_4_ != 33.0) || (NAN((float)val_8._0_4_))) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_global_get(uVar8,&val_10.of);
          if (val_9._0_8_ != 0x22) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_global_get(pwVar11,&val_11.of);
          if (((float)val_10._0_4_ != 37.0) || (NAN((float)val_10._0_4_))) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_global_get(pwVar12,&results_8[0].of);
          if (val_11._0_8_ != 0x26) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_func_call(pwVar15,0,&results_9[0].of);
          if (((float)results_8[0]._0_4_ != 33.0) || (NAN((float)results_8[0]._0_4_))) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_func_call(pwVar16,0,&results_10[0].of);
          if (results_9[0]._0_8_ != 0x22) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_func_call(pwVar19,0,&results_11[0].of);
          if (((float)results_10[0]._0_4_ != 37.0) || (NAN((float)results_10[0]._0_4_))) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_func_call(pwVar20,0,&args73[0].of);
          if (results_11[0]._0_8_ != 0x26) {
            printf("> Error reading value\n");
            exit(1);
          }
          args74[0].of.i64 = 2;
          args73[0].kind = '\0';
          args73[0]._1_7_ = 0x429200;
          wasm_func_call(pwVar21,&args74[0].of,0);
          args77[0].of.i64 = 1;
          args74[0].kind = 'J';
          args74[0]._1_7_ = 0;
          wasm_func_call(pwVar22,&args77[0].of,0);
          args78[0].of.i64 = 2;
          args77[0].kind = '\0';
          args77[0]._1_7_ = 0x429a00;
          wasm_func_call(pwVar23,&args78[0].of,0);
          val_12.of.i64 = 1;
          args78[0].kind = 'N';
          args78[0]._1_7_ = 0;
          wasm_func_call(pwVar24,&val_12.of,0);
          wasm_global_get(val_i64_4.of.i64,&val_13.of);
          if (((float)val_12._0_4_ != 73.0) || (NAN((float)val_12._0_4_))) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_global_get(uVar8,&val_14.of);
          if (val_13._0_8_ != 0x4a) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_global_get(pwVar11,&val_15.of);
          if (((float)val_14._0_4_ != 77.0) || (NAN((float)val_14._0_4_))) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_global_get(pwVar12,&results_12[0].of);
          if (val_15._0_8_ != 0x4e) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_func_call(pwVar15,0,&results_13[0].of);
          if (((float)results_12[0]._0_4_ != 73.0) || (NAN((float)results_12[0]._0_4_))) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_func_call(pwVar16,0,&results_14[0].of);
          if (results_13[0]._0_8_ != 0x4a) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_func_call(pwVar19,0,&results_15[0].of);
          if (((float)results_14[0]._0_4_ != 77.0) || (NAN((float)results_14[0]._0_4_))) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_func_call(pwVar20,0,local_428);
          if (results_15[0]._0_8_ != 0x4e) {
            printf("> Error reading value\n");
            exit(1);
          }
          wasm_global_delete(val_i64_2.of.i64);
          wasm_global_delete(val_f32_3.of.i64);
          wasm_global_delete(val_i64_4.of.i64);
          wasm_global_delete(uVar8);
          wasm_extern_vec_delete(&i);
          wasm_instance_delete(exports.data);
          printf("Shutting down...\n");
          wasm_store_delete(uVar2);
          wasm_engine_delete(uVar1);
          printf("Done.\n");
          argv_local._4_4_ = 0;
        }
      }
    }
    else {
      printf("> Error loading module!\n");
      argv_local._4_4_ = 1;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("global.wasm", "r");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Create external globals.
  printf("Creating globals...\n");
  own wasm_globaltype_t* const_f32_type = wasm_globaltype_new(
    wasm_valtype_new(WASM_F32), WASM_CONST);
  own wasm_globaltype_t* const_i64_type = wasm_globaltype_new(
    wasm_valtype_new(WASM_I64), WASM_CONST);
  own wasm_globaltype_t* var_f32_type = wasm_globaltype_new(
    wasm_valtype_new(WASM_F32), WASM_VAR);
  own wasm_globaltype_t* var_i64_type = wasm_globaltype_new(
    wasm_valtype_new(WASM_I64), WASM_VAR);

  wasm_val_t val_f32_1 = {.kind = WASM_F32, .of = {.f32 = 1}};
  own wasm_global_t* const_f32_import =
    wasm_global_new(store, const_f32_type, &val_f32_1);
  wasm_val_t val_i64_2 = {.kind = WASM_I64, .of = {.i64 = 2}};
  own wasm_global_t* const_i64_import =
    wasm_global_new(store, const_i64_type, &val_i64_2);
  wasm_val_t val_f32_3 = {.kind = WASM_F32, .of = {.f32 = 3}};
  own wasm_global_t* var_f32_import =
    wasm_global_new(store, var_f32_type, &val_f32_3);
  wasm_val_t val_i64_4 = {.kind = WASM_I64, .of = {.i64 = 4}};
  own wasm_global_t* var_i64_import =
    wasm_global_new(store, var_i64_type, &val_i64_4);

  wasm_globaltype_delete(const_f32_type);
  wasm_globaltype_delete(const_i64_type);
  wasm_globaltype_delete(var_f32_type);
  wasm_globaltype_delete(var_i64_type);

  // Instantiate.
  printf("Instantiating module...\n");
  const wasm_extern_t* imports[] = {
    wasm_global_as_extern(const_f32_import),
    wasm_global_as_extern(const_i64_import),
    wasm_global_as_extern(var_f32_import),
    wasm_global_as_extern(var_i64_import)
  };
  own wasm_instance_t* instance =
    wasm_instance_new(store, module, imports, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  wasm_module_delete(module);

  // Extract export.
  printf("Extracting exports...\n");
  own wasm_extern_vec_t exports;
  wasm_instance_exports(instance, &exports);
  size_t i = 0;
  wasm_global_t* const_f32_export = get_export_global(&exports, i++);
  wasm_global_t* const_i64_export = get_export_global(&exports, i++);
  wasm_global_t* var_f32_export = get_export_global(&exports, i++);
  wasm_global_t* var_i64_export = get_export_global(&exports, i++);
  wasm_func_t* get_const_f32_import = get_export_func(&exports, i++);
  wasm_func_t* get_const_i64_import = get_export_func(&exports, i++);
  wasm_func_t* get_var_f32_import = get_export_func(&exports, i++);
  wasm_func_t* get_var_i64_import = get_export_func(&exports, i++);
  wasm_func_t* get_const_f32_export = get_export_func(&exports, i++);
  wasm_func_t* get_const_i64_export = get_export_func(&exports, i++);
  wasm_func_t* get_var_f32_export = get_export_func(&exports, i++);
  wasm_func_t* get_var_i64_export = get_export_func(&exports, i++);
  wasm_func_t* set_var_f32_import = get_export_func(&exports, i++);
  wasm_func_t* set_var_i64_import = get_export_func(&exports, i++);
  wasm_func_t* set_var_f32_export = get_export_func(&exports, i++);
  wasm_func_t* set_var_i64_export = get_export_func(&exports, i++);

  // Try cloning.
  own wasm_global_t* copy = wasm_global_copy(var_f32_import);
  assert(wasm_global_same(var_f32_import, copy));
  wasm_global_delete(copy);

  // Interact.
  printf("Accessing globals...\n");

  // Check initial values.
  check_global(const_f32_import, f32, 1);
  check_global(const_i64_import, i64, 2);
  check_global(var_f32_import, f32, 3);
  check_global(var_i64_import, i64, 4);
  check_global(const_f32_export, f32, 5);
  check_global(const_i64_export, i64, 6);
  check_global(var_f32_export, f32, 7);
  check_global(var_i64_export, i64, 8);

  check_call(get_const_f32_import, f32, 1);
  check_call(get_const_i64_import, i64, 2);
  check_call(get_var_f32_import, f32, 3);
  check_call(get_var_i64_import, i64, 4);
  check_call(get_const_f32_export, f32, 5);
  check_call(get_const_i64_export, i64, 6);
  check_call(get_var_f32_export, f32, 7);
  check_call(get_var_i64_export, i64, 8);

  // Modify variables through API and check again.
  wasm_val_t val33 = {.kind = WASM_F32, .of = {.f32 = 33}};
  wasm_global_set(var_f32_import, &val33);
  wasm_val_t val34 = {.kind = WASM_I64, .of = {.i64 = 34}};
  wasm_global_set(var_i64_import, &val34);
  wasm_val_t val37 = {.kind = WASM_F32, .of = {.f32 = 37}};
  wasm_global_set(var_f32_export, &val37);
  wasm_val_t val38 = {.kind = WASM_I64, .of = {.i64 = 38}};
  wasm_global_set(var_i64_export, &val38);

  check_global(var_f32_import, f32, 33);
  check_global(var_i64_import, i64, 34);
  check_global(var_f32_export, f32, 37);
  check_global(var_i64_export, i64, 38);

  check_call(get_var_f32_import, f32, 33);
  check_call(get_var_i64_import, i64, 34);
  check_call(get_var_f32_export, f32, 37);
  check_call(get_var_i64_export, i64, 38);

  // Modify variables through calls and check again.
  wasm_val_t args73[] = { {.kind = WASM_F32, .of = {.f32 = 73}} };
  wasm_func_call(set_var_f32_import, args73, NULL);
  wasm_val_t args74[] = { {.kind = WASM_I64, .of = {.i64 = 74}} };
  wasm_func_call(set_var_i64_import, args74, NULL);
  wasm_val_t args77[] = { {.kind = WASM_F32, .of = {.f32 = 77}} };
  wasm_func_call(set_var_f32_export, args77, NULL);
  wasm_val_t args78[] = { {.kind = WASM_I64, .of = {.i64 = 78}} };
  wasm_func_call(set_var_i64_export, args78, NULL);

  check_global(var_f32_import, f32, 73);
  check_global(var_i64_import, i64, 74);
  check_global(var_f32_export, f32, 77);
  check_global(var_i64_export, i64, 78);

  check_call(get_var_f32_import, f32, 73);
  check_call(get_var_i64_import, i64, 74);
  check_call(get_var_f32_export, f32, 77);
  check_call(get_var_i64_export, i64, 78);

  wasm_global_delete(const_f32_import);
  wasm_global_delete(const_i64_import);
  wasm_global_delete(var_f32_import);
  wasm_global_delete(var_i64_import);
  wasm_extern_vec_delete(&exports);
  wasm_instance_delete(instance);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}